

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

void __thiscall
Fl_Paged_Device::draw_decorated_window
          (Fl_Paged_Device *this,Fl_Window *win,int x_offset,int y_offset,Fl_Surface_Device *toset)

{
  Window WVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  Fl_Display_Device *pFVar5;
  uchar *puVar6;
  bool bVar7;
  int bt;
  int bx;
  uint n;
  uchar *local_70;
  uchar *local_68;
  Fl_Paged_Device *local_60;
  Window parent;
  uchar *local_50;
  Window *children;
  Window root;
  Window child_win;
  
  local_60 = this;
  pFVar5 = Fl_Display_Device::display_device();
  (*(pFVar5->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar5);
  (*(win->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(win);
  Fl::check();
  Fl_Window::make_current(win);
  WVar1 = fl_window;
  n = 0;
  iVar4 = XQueryTree(fl_display,fl_window,&root,&parent,&children);
  if (iVar4 == 0) {
    bVar7 = false;
  }
  else {
    iVar4 = XTranslateCoordinates(fl_display,fl_window,parent,0,0,&bx,&bt,&child_win);
    bVar7 = iVar4 == 1;
  }
  if (n != 0) {
    XFree();
  }
  if ((bVar7) && (root != parent)) {
    fl_window = parent;
    local_68 = (uchar *)0x0;
    local_50 = fl_read_image((uchar *)0x0,0,0,-(bx * 2 + (win->super_Fl_Group).super_Fl_Widget.w_),
                             bt,0);
    local_70 = (uchar *)0x0;
    puVar6 = (uchar *)0x0;
    if (bx != 0) {
      local_68 = fl_read_image((uchar *)0x0,0,bt,-bx,bx + (win->super_Fl_Group).super_Fl_Widget.h_,0
                              );
      local_70 = fl_read_image((uchar *)0x0,(win->super_Fl_Group).super_Fl_Widget.w_ + bx,bt,-bx,
                               bx + (win->super_Fl_Group).super_Fl_Widget.h_,0);
      puVar6 = fl_read_image((uchar *)0x0,0,(win->super_Fl_Group).super_Fl_Widget.h_ + bt,
                             -(bx * 2 + (win->super_Fl_Group).super_Fl_Widget.w_),bx,0);
    }
    fl_window = WVar1;
    (*(toset->super_Fl_Device)._vptr_Fl_Device[3])(toset);
    puVar2 = local_50;
    if (local_50 != (uchar *)0x0) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
                (fl_graphics_driver,local_50,(ulong)(uint)x_offset,(ulong)(uint)y_offset,
                 (ulong)(uint)(bx * 2 + (win->super_Fl_Group).super_Fl_Widget.w_),(ulong)(uint)bt,3,
                 0);
      operator_delete__(puVar2);
    }
    puVar3 = local_68;
    puVar2 = local_70;
    if (bx != 0) {
      if (local_68 != (uchar *)0x0) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
                  (fl_graphics_driver,local_68,(ulong)(uint)x_offset,(ulong)(uint)(bt + y_offset),
                   (ulong)(uint)bx,(ulong)(uint)((win->super_Fl_Group).super_Fl_Widget.h_ + bx),3,0)
        ;
      }
      if (puVar2 != (uchar *)0x0) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
                  (fl_graphics_driver,puVar2,
                   (ulong)(uint)((win->super_Fl_Group).super_Fl_Widget.w_ + x_offset + bx),
                   (ulong)(uint)(bt + y_offset),(ulong)(uint)bx,
                   (ulong)(uint)((win->super_Fl_Group).super_Fl_Widget.h_ + bx),3,0);
      }
      if (puVar6 != (uchar *)0x0) {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
                  (fl_graphics_driver,puVar6,(ulong)(uint)x_offset,
                   (ulong)(uint)(bt + y_offset + (win->super_Fl_Group).super_Fl_Widget.h_),
                   (ulong)(uint)(bx * 2 + (win->super_Fl_Group).super_Fl_Widget.w_),(ulong)(uint)bx,
                   3,0);
      }
      if (puVar3 != (uchar *)0x0) {
        operator_delete__(puVar3);
      }
      if (puVar2 != (uchar *)0x0) {
        operator_delete__(puVar2);
      }
      if (puVar6 != (uchar *)0x0) {
        operator_delete__(puVar6);
      }
    }
    x_offset = x_offset + bx;
    y_offset = y_offset + bt;
  }
  else {
    (*(toset->super_Fl_Device)._vptr_Fl_Device[3])(toset);
  }
  (*(local_60->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[0xe])
            (local_60,win,(ulong)(uint)x_offset,(ulong)(uint)y_offset);
  return;
}

Assistant:

void Fl_Paged_Device::draw_decorated_window(Fl_Window *win, int x_offset, int y_offset, Fl_Surface_Device *toset)
{
  Fl_Display_Device::display_device()->set_current();
  win->show();
  Fl::check();
  win->make_current();
  Window root, parent, *children, child_win, from;
  unsigned n = 0;
  int bx, bt, do_it;
  from = fl_window;
  do_it = (XQueryTree(fl_display, fl_window, &root, &parent, &children, &n) != 0 && 
	   XTranslateCoordinates(fl_display, fl_window, parent, 0, 0, &bx, &bt, &child_win) == True);
  if (n) XFree(children);
  // hack to bypass STR #2648: when compiz is used, root and parent are the same window 
  // and I don't know where to find the window decoration
  if (do_it && root == parent) do_it = 0; 
  if (!do_it) {
    toset->set_current();
    this->print_widget(win, x_offset, y_offset);
    return;
  }
  fl_window = parent;
  uchar *top_image = 0, *left_image = 0, *right_image = 0, *bottom_image = 0;
  top_image = fl_read_image(NULL, 0, 0, - (win->w() + 2 * bx), bt);
  if (bx) {
    left_image = fl_read_image(NULL, 0, bt, -bx, win->h() + bx);
    right_image = fl_read_image(NULL, win->w() + bx, bt, -bx, win->h() + bx);
    bottom_image = fl_read_image(NULL, 0, bt + win->h(), -(win->w() + 2*bx), bx);
  }
  fl_window = from;
  toset->set_current();
  if (top_image) {
    fl_draw_image(top_image, x_offset, y_offset, win->w() + 2 * bx, bt, 3);
    delete[] top_image;
  }
  if (bx) {
    if (left_image) fl_draw_image(left_image, x_offset, y_offset + bt, bx, win->h() + bx, 3);
    if (right_image) fl_draw_image(right_image, x_offset + win->w() + bx, y_offset + bt, bx, win->h() + bx, 3);
    if (bottom_image) fl_draw_image(bottom_image, x_offset, y_offset + bt + win->h(), win->w() + 2*bx, bx, 3);
    if (left_image) delete[] left_image;
    if (right_image) delete[] right_image;
    if (bottom_image) delete[] bottom_image;
  }
  this->print_widget( win, x_offset + bx, y_offset + bt );
}